

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool __thiscall
gguf_reader::read<signed_char>
          (gguf_reader *this,vector<signed_char,_std::allocator<signed_char>_> *dst,size_t n)

{
  bool bVar1;
  char *pcVar2;
  vector<signed_char,_std::allocator<signed_char>_> *in_RSI;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  size_t i;
  char *dst_00;
  char *local_28;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(in_RDI,(size_type)in_RSI);
  local_28 = (char *)0x0;
  while( true ) {
    dst_00 = local_28;
    pcVar2 = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::size(in_RSI);
    if (pcVar2 <= dst_00) {
      return true;
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::operator[](in_RSI,(size_type)local_28);
    bVar1 = read<signed_char>((gguf_reader *)in_RDI,dst_00);
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }